

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_handle ma_dlopen(ma_context *pContext,char *filename)

{
  ma_handle pvVar1;
  ma_log *pmVar2;
  
  if (pContext == (ma_context *)0x0) {
    pmVar2 = (ma_log *)0x0;
  }
  else {
    pmVar2 = pContext->pLog;
  }
  ma_log_postf(pmVar2,4,"Loading library: %s\n",filename);
  pvVar1 = (ma_handle)dlopen(filename,2);
  if (pvVar1 == (ma_handle)0x0) {
    if (pContext == (ma_context *)0x0) {
      pmVar2 = (ma_log *)0x0;
    }
    else {
      pmVar2 = pContext->pLog;
    }
    ma_log_postf(pmVar2,3,"Failed to load library: %s\n",filename);
  }
  return pvVar1;
}

Assistant:

MA_API ma_handle ma_dlopen(ma_context* pContext, const char* filename)
{
    ma_handle handle;

    ma_log_postf(ma_context_get_log(pContext), MA_LOG_LEVEL_DEBUG, "Loading library: %s\n", filename);

#ifdef _WIN32
    /* From MSDN: Desktop applications cannot use LoadPackagedLibrary; if a desktop application calls this function it fails with APPMODEL_ERROR_NO_PACKAGE.*/
    #if !defined(WINAPI_FAMILY) || (defined(WINAPI_FAMILY) && (defined(WINAPI_FAMILY_DESKTOP_APP) && WINAPI_FAMILY == WINAPI_FAMILY_DESKTOP_APP))
        handle = (ma_handle)LoadLibraryA(filename);
    #else
        /* *sigh* It appears there is no ANSI version of LoadPackagedLibrary()... */
        WCHAR filenameW[4096];
        if (MultiByteToWideChar(CP_UTF8, 0, filename, -1, filenameW, sizeof(filenameW)) == 0) {
            handle = NULL;
        } else {
            handle = (ma_handle)LoadPackagedLibrary(filenameW, 0);
        }
    #endif
#else
    handle = (ma_handle)dlopen(filename, RTLD_NOW);
#endif

    /*
    I'm not considering failure to load a library an error nor a warning because seamlessly falling through to a lower-priority
    backend is a deliberate design choice. Instead I'm logging it as an informational message.
    */
    if (handle == NULL) {
        ma_log_postf(ma_context_get_log(pContext), MA_LOG_LEVEL_INFO, "Failed to load library: %s\n", filename);
    }

    (void)pContext; /* It's possible for pContext to be unused. */
    return handle;
}